

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixGetTempname(int nBuf,char *zBuf)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  sqlite3_mutex *psVar4;
  char **ppcVar5;
  uint uVar6;
  long lVar7;
  stat buf;
  undefined8 local_c0 [3];
  uint local_a8;
  
  *zBuf = '\0';
  if ((sqlite3Config.bCoreMutex != '\0') &&
     (psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(0xb), psVar4 != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  ppcVar5 = &sqlite3_temp_directory;
  lVar7 = 0;
  while( true ) {
    pcVar1 = *ppcVar5;
    if ((((pcVar1 != (char *)0x0) && (iVar2 = (*aSyscall[4].pCurrent)(pcVar1,local_c0), iVar2 == 0))
        && ((local_a8 & 0xf000) == 0x4000)) &&
       (iVar2 = (*aSyscall[2].pCurrent)(pcVar1,3), iVar2 == 0)) {
      uVar6 = 0;
      goto LAB_001284c8;
    }
    if (lVar7 == 0x30) break;
    ppcVar5 = (char **)((long)azTempDirs + lVar7);
    lVar7 = lVar7 + 8;
  }
  iVar2 = 0x190a;
  goto LAB_00128483;
  while( true ) {
    uVar6 = uVar6 + 1;
    iVar2 = 0;
    iVar3 = (*aSyscall[2].pCurrent)(zBuf,0);
    if (iVar3 != 0) break;
LAB_001284c8:
    sqlite3_randomness(8,local_c0);
    zBuf[(long)nBuf + -2] = '\0';
    sqlite3_snprintf(nBuf,zBuf,"%s/etilqs_%llx%c",pcVar1,local_c0[0],0);
    iVar2 = 1;
    if ((zBuf[(long)nBuf + -2] != '\0') || (10 < uVar6)) break;
  }
LAB_00128483:
  if ((sqlite3Config.bCoreMutex != '\0') &&
     (psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(0xb), psVar4 != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return iVar2;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  const char *zDir;
  int iLimit = 0;
  int rc = SQLITE_OK;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing.
  */
  zBuf[0] = 0;
  SimulateIOError( return SQLITE_IOERR );

  sqlite3_mutex_enter(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  zDir = unixTempFileDir();
  if( zDir==0 ){
    rc = SQLITE_IOERR_GETTEMPPATH;
  }else{
    do{
      u64 r;
      sqlite3_randomness(sizeof(r), &r);
      assert( nBuf>2 );
      zBuf[nBuf-2] = 0;
      sqlite3_snprintf(nBuf, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX"%llx%c",
                       zDir, r, 0);
      if( zBuf[nBuf-2]!=0 || (iLimit++)>10 ){
        rc = SQLITE_ERROR;
        break;
      }
    }while( osAccess(zBuf,0)==0 );
  }
  sqlite3_mutex_leave(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  return rc;
}